

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Type.cpp
# Opt level: O3

int64_t soul::Value::PackedData::wrapOrClampToLegalValue(Type *type,int64_t value)

{
  int64_t iVar1;
  long lVar2;
  
  if (type->category == clamp) {
    lVar2 = (long)type->boundingSize + -1;
    if (value < type->boundingSize) {
      lVar2 = value;
    }
    iVar1 = 0;
    if (-1 < value) {
      iVar1 = lVar2;
    }
    return iVar1;
  }
  if (type->category == wrap) {
    lVar2 = value % (long)type->boundingSize;
    return (lVar2 >> 0x3f & (long)type->boundingSize) + lVar2;
  }
  throwInternalCompilerError("wrapOrClampToLegalValue",0x1bd);
}

Assistant:

bool Type::isWrapped() const              { return category == Category::wrap; }